

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Token.cpp
# Opt level: O0

int __thiscall
slang::parsing::Trivia::clone
          (Trivia *this,__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  char cVar1;
  size_t *psVar2;
  SyntaxNode *pSVar3;
  Trivia result;
  BumpAllocator *in_stack_ffffffffffffffc8;
  anon_union_12_4_39e54f29_for_Trivia_0 local_10;
  byte bStack_4;
  undefined1 uStack_3;
  
  Trivia((Trivia *)&local_10.rawText);
  uStack_3 = *(undefined1 *)((long)&((SyntaxNode *)this)->parent + 5);
  bStack_4 = *(byte *)((long)&((SyntaxNode *)this)->parent + 4) & 1;
  cVar1 = *(char *)((long)&((SyntaxNode *)this)->parent + 5);
  if (cVar1 == '\x06') {
    local_10._0_4_ = (undefined4)*(undefined8 *)this;
  }
  else if (cVar1 == '\a' || cVar1 == '\b') {
    if (((ulong)__child_stack & 1) == 0) {
      local_10._0_4_ = (undefined4)*(undefined8 *)this;
    }
    else {
      pSVar3 = slang::syntax::deepClone((SyntaxNode *)this,in_stack_ffffffffffffffc8);
      local_10._0_4_ = SUB84(pSVar3,0);
    }
  }
  else {
    if (((ulong)((SyntaxNode *)this)->parent & 0x100000000) == 0) {
      local_10.rawText.ptr = (char *)*(undefined8 *)this;
    }
    else {
      local_10.fullLocation =
           BumpAllocator::emplace<slang::parsing::Trivia::FullLocation>((BumpAllocator *)this);
      psVar2 = *(size_t **)this;
      ((local_10.fullLocation)->text)._M_len = *psVar2;
      ((local_10.fullLocation)->text)._M_str = (char *)psVar2[1];
      ((FullLocation *)local_10.syntaxNode)->location = *(SourceLocation *)(*(long *)this + 0x10);
    }
  }
  return local_10._0_4_;
}

Assistant:

Trivia Trivia::clone(BumpAllocator& alloc, bool deep) const {
    Trivia result;
    result.kind = kind;
    result.hasFullLocation = hasFullLocation;

    switch (kind) {
        case TriviaKind::Directive:
        case TriviaKind::SkippedSyntax:
            if (deep)
                result.syntaxNode = syntax::deepClone(*syntaxNode, alloc);
            else
                result.syntaxNode = syntaxNode;
            break;
        case TriviaKind::SkippedTokens:
            result.tokens = tokens;
            break;
        default:
            if (hasFullLocation) {
                result.fullLocation = alloc.emplace<FullLocation>();
                result.fullLocation->text = fullLocation->text;
                result.fullLocation->location = fullLocation->location;
            }
            else {
                result.rawText = rawText;
            }
            break;
    }

    return result;
}